

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O1

bool dxil_spv::emit_get_sample_position(Impl *impl,CallInst *instruction,bool image)

{
  Id IVar1;
  Id IVar2;
  Id IVar3;
  Builder *this;
  Value *pVVar4;
  Operation *pOVar5;
  Builder *this_00;
  Operation *pOVar6;
  Operation *this_01;
  undefined7 in_register_00000011;
  undefined4 *puVar7;
  size_t i;
  long lVar8;
  uint index;
  uint j;
  long lVar9;
  Vector<spv::Id> constituents;
  Vector<Id> local_78;
  Builder *local_58;
  Id local_4c;
  Id local_48;
  Id local_44 [3];
  CallInst *local_38;
  
  this = Converter::Impl::builder(impl);
  if ((int)CONCAT71(in_register_00000011,image) == 0) {
    IVar1 = build_rasterizer_sample_count(impl);
    index = 1;
  }
  else {
    pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
    IVar1 = Converter::Impl::get_id_for_value(impl,pVVar4,0);
    IVar2 = spv::Builder::makeIntegerType(this,0x20,false);
    pOVar5 = Converter::Impl::allocate(impl,OpImageQuerySamples,IVar2);
    Operation::add_id(pOVar5,IVar1);
    Converter::Impl::add(impl,pOVar5,false);
    IVar1 = pOVar5->id;
    index = 2;
  }
  pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,index);
  IVar2 = Converter::Impl::get_id_for_value(impl,pVVar4,0);
  this_00 = Converter::Impl::builder(impl);
  local_38 = instruction;
  if (impl->texture_sample_pos_lut_id == 0) {
    local_58 = this;
    local_48 = IVar2;
    IVar2 = spv::Builder::makeFloatType(this_00,0x20);
    local_4c = spv::Builder::makeVectorType(this_00,IVar2,2);
    local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)allocate_in_thread(0x7c);
    local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish =
         local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_start + 0x1f;
    local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[0] = 0;
    local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[1] = 0;
    local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[2] = 0;
    local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[3] = 0;
    local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[4] = 0;
    local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[5] = 0;
    local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[6] = 0;
    local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[7] = 0;
    local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[8] = 0;
    local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[9] = 0;
    local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[10] = 0;
    local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[0xb] = 0;
    local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[0xc] = 0;
    local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[0xd] = 0;
    local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[0xe] = 0;
    local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[0xf] = 0;
    local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[0x10] = 0;
    local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[0x11] = 0;
    local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[0x12] = 0;
    local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[0x13] = 0;
    local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[0x14] = 0;
    local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[0x15] = 0;
    local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[0x16] = 0;
    local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[0x17] = 0;
    local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[0x18] = 0;
    local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[0x19] = 0;
    local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[0x1a] = 0;
    local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[0x1b] = 0;
    local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[0x1b] = 0;
    local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[0x1c] = 0;
    local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[0x1d] = 0;
    local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[0x1e] = 0;
    puVar7 = &build_sample_position_lut(dxil_spv::Converter::Impl&)::standard_sample_positions;
    lVar8 = 0;
    local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage =
         local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    do {
      lVar9 = 0;
      do {
        IVar2 = spv::Builder::makeFloatConstant(this_00,(float)puVar7[lVar9],false);
        local_44[lVar9] = IVar2;
        lVar9 = lVar9 + 1;
      } while (lVar9 == 1);
      IVar2 = spv::Builder::makeFloatType(this_00,0x20);
      IVar2 = Converter::Impl::build_constant_vector(impl,IVar2,local_44,2);
      local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar8] = IVar2;
      lVar8 = lVar8 + 1;
      puVar7 = puVar7 + 2;
    } while (lVar8 != 0x1f);
    IVar2 = spv::Builder::makeIntegerType(this_00,0x20,false);
    IVar2 = spv::Builder::makeIntConstant(this_00,IVar2,0x1f,false);
    IVar2 = spv::Builder::makeArrayType(this_00,local_4c,IVar2,0);
    IVar3 = spv::Builder::makeCompositeConstant(this_00,IVar2,&local_78,false);
    IVar2 = Converter::Impl::create_variable_with_initializer
                      (impl,StorageClassPrivate,IVar2,IVar3,"Texture2DMSSamplePositionLUT");
    impl->texture_sample_pos_lut_id = IVar2;
    this = local_58;
    IVar2 = local_48;
    if (local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      free_in_thread(local_78.
                     super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_start);
      this = local_58;
      IVar2 = local_48;
    }
  }
  IVar3 = spv::Builder::makeIntegerType(this,0x20,false);
  pOVar5 = Converter::Impl::allocate(impl,OpISub,IVar3);
  local_44[0] = IVar1;
  IVar3 = spv::Builder::makeIntegerType(this,0x20,false);
  local_44[1] = spv::Builder::makeIntConstant(this,IVar3,1,false);
  local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x2;
  local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = local_44;
  Operation::add_ids(pOVar5,(initializer_list<unsigned_int> *)&local_78);
  Converter::Impl::add(impl,pOVar5,false);
  IVar3 = spv::Builder::makeIntegerType(this,0x20,false);
  pOVar6 = Converter::Impl::allocate(impl,OpIAdd,IVar3);
  local_44[0] = pOVar5->id;
  local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x2;
  local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = local_44;
  local_58 = (Builder *)pOVar6;
  local_44[1] = IVar2;
  Operation::add_ids(pOVar6,(initializer_list<unsigned_int> *)&local_78);
  Converter::Impl::add(impl,pOVar6,false);
  IVar3 = spv::Builder::makeBoolType(this);
  pOVar5 = Converter::Impl::allocate(impl,OpULessThan,IVar3);
  local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x2;
  local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = local_44;
  local_44[0] = IVar2;
  local_44[1] = IVar1;
  Operation::add_ids(pOVar5,(initializer_list<unsigned_int> *)&local_78);
  Converter::Impl::add(impl,pOVar5,false);
  IVar2 = spv::Builder::makeBoolType(this);
  pOVar6 = Converter::Impl::allocate(impl,OpULessThanEqual,IVar2);
  local_44[0] = IVar1;
  IVar1 = spv::Builder::makeIntegerType(this,0x20,false);
  local_44[1] = spv::Builder::makeIntConstant(this,IVar1,0x10,false);
  local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = local_44;
  local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x2;
  Operation::add_ids(pOVar6,(initializer_list<unsigned_int> *)&local_78);
  Converter::Impl::add(impl,pOVar6,false);
  IVar1 = spv::Builder::makeBoolType(this);
  this_01 = Converter::Impl::allocate(impl,OpLogicalAnd,IVar1);
  local_44[0] = pOVar5->id;
  local_44[1] = pOVar6->id;
  local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x2;
  local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = local_44;
  Operation::add_ids(this_01,(initializer_list<unsigned_int> *)&local_78);
  Converter::Impl::add(impl,this_01,false);
  IVar1 = spv::Builder::makeIntegerType(this,0x20,false);
  pOVar5 = Converter::Impl::allocate(impl,OpSelect,IVar1);
  local_44[0] = this_01->id;
  local_44[1] = *(Id *)((long)local_58 + 4);
  IVar1 = spv::Builder::makeIntegerType(this,0x20,false);
  local_44[2] = spv::Builder::makeIntConstant(this,IVar1,0,false);
  local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x3;
  local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = local_44;
  Operation::add_ids(pOVar5,(initializer_list<unsigned_int> *)&local_78);
  Converter::Impl::add(impl,pOVar5,false);
  IVar1 = spv::Builder::makeFloatType(this,0x20);
  IVar1 = spv::Builder::makeVectorType(this,IVar1,2);
  IVar2 = spv::Builder::makePointer(this,StorageClassPrivate,IVar1);
  pOVar6 = Converter::Impl::allocate(impl,OpAccessChain,IVar2);
  local_44[0] = impl->texture_sample_pos_lut_id;
  local_44[1] = pOVar5->id;
  local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x2;
  local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = local_44;
  Operation::add_ids(pOVar6,(initializer_list<unsigned_int> *)&local_78);
  Converter::Impl::add(impl,pOVar6,false);
  pOVar5 = Converter::Impl::allocate(impl,OpLoad,(Value *)local_38,IVar1);
  Operation::add_id(pOVar5,pOVar6->id);
  Converter::Impl::add(impl,pOVar5,false);
  local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_78.
                         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x32);
  std::
  _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
  ::_M_insert_unique<spv::Capability_const&>
            ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
              *)&this->capabilities,(Capability *)&local_78);
  return true;
}

Assistant:

bool emit_get_sample_position(Converter::Impl &impl, const llvm::CallInst *instruction, bool image)
{
	auto &builder = impl.builder();

	spv::Id sample_count_id;
	if (image)
	{
		spv::Id image_id = impl.get_id_for_value(instruction->getOperand(1));

		auto *query_samples_op = impl.allocate(spv::OpImageQuerySamples, builder.makeUintType(32));
		query_samples_op->add_id(image_id);
		impl.add(query_samples_op);
		sample_count_id = query_samples_op->id;
	}
	else
	{
		sample_count_id = build_rasterizer_sample_count(impl);
	}

	spv::Id sample_index_id = impl.get_id_for_value(instruction->getOperand(image ? 2 : 1));

	// Build the LUT if we have to.
	build_sample_position_lut(impl);

	// Sample count is only POT, so table starts at N - 1.
	auto *lut_base_offset_op = impl.allocate(spv::OpISub, builder.makeUintType(32));
	lut_base_offset_op->add_ids({ sample_count_id, builder.makeUintConstant(1) });
	impl.add(lut_base_offset_op);

	// Build LUT offset.
	auto *lut_offset_op = impl.allocate(spv::OpIAdd, builder.makeUintType(32));
	lut_offset_op->add_ids({ lut_base_offset_op->id, sample_index_id });
	impl.add(lut_offset_op);

	// Range check sample index against actual texture.
	auto *cmp0_op = impl.allocate(spv::OpULessThan, builder.makeBoolType());
	cmp0_op->add_ids({ sample_index_id, sample_count_id });
	impl.add(cmp0_op);

	// Range check sample index against max supported 16.
	auto *cmp1_op = impl.allocate(spv::OpULessThanEqual, builder.makeBoolType());
	cmp1_op->add_ids({ sample_count_id, builder.makeUintConstant(16) });
	impl.add(cmp1_op);

	auto *cmp_op = impl.allocate(spv::OpLogicalAnd, builder.makeBoolType());
	cmp_op->add_ids({ cmp0_op->id, cmp1_op->id });
	impl.add(cmp_op);

	auto *final_lut_index_op = impl.allocate(spv::OpSelect, builder.makeUintType(32));
	final_lut_index_op->add_ids({ cmp_op->id, lut_offset_op->id, builder.makeUintConstant(0) });
	impl.add(final_lut_index_op);

	spv::Id vec2_type = builder.makeVectorType(builder.makeFloatType(32), 2);

	auto *chain_op = impl.allocate(spv::OpAccessChain, builder.makePointer(spv::StorageClassPrivate, vec2_type));
	chain_op->add_ids({ impl.texture_sample_pos_lut_id, final_lut_index_op->id });
	impl.add(chain_op);

	auto *load_op = impl.allocate(spv::OpLoad, instruction, vec2_type);
	load_op->add_id(chain_op->id);
	impl.add(load_op);

	builder.addCapability(spv::CapabilityImageQuery);
	return true;
}